

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_object_data_finalizer(JSRuntime *rt,JSValue val)

{
  int *piVar1;
  int iVar2;
  JSValue v;
  JSValueUnion JVar3;
  
  JVar3 = val.u;
  piVar1 = (int *)(((JSValue *)((long)JVar3.ptr + 0x30))->u).ptr;
  v = *(JSValue *)((long)JVar3.ptr + 0x30);
  if ((0xfffffff4 < (uint)*(undefined8 *)((long)JVar3.ptr + 0x38)) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,v);
  }
  *(undefined4 *)((long)JVar3.ptr + 0x30) = 0;
  *(undefined8 *)((long)JVar3.ptr + 0x38) = 3;
  return;
}

Assistant:

static void js_object_data_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JS_FreeValueRT(rt, p->u.object_data);
    p->u.object_data = JS_UNDEFINED;
}